

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

int combine_prior_with_tpl_boost
              (double min_factor,double max_factor,int prior_boost,int tpl_boost,int frames_to_key)

{
  int in_EDX;
  int in_ESI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  int boost;
  double range;
  double factor;
  double local_48;
  double local_40;
  
  dVar1 = sqrt((double)in_EDX);
  local_40 = in_XMM1_Qa;
  if (dVar1 < in_XMM1_Qa) {
    local_40 = dVar1;
  }
  local_48 = in_XMM0_Qa;
  if (in_XMM0_Qa < local_40) {
    local_48 = local_40;
  }
  return (int)(((local_48 - in_XMM0_Qa) * (double)in_EDI +
               ((in_XMM1_Qa - in_XMM0_Qa) - (local_48 - in_XMM0_Qa)) * (double)in_ESI) /
              (in_XMM1_Qa - in_XMM0_Qa));
}

Assistant:

static inline int combine_prior_with_tpl_boost(double min_factor,
                                               double max_factor,
                                               int prior_boost, int tpl_boost,
                                               int frames_to_key) {
  double factor = sqrt((double)frames_to_key);
  double range = max_factor - min_factor;
  factor = AOMMIN(factor, max_factor);
  factor = AOMMAX(factor, min_factor);
  factor -= min_factor;
  int boost =
      (int)((factor * prior_boost + (range - factor) * tpl_boost) / range);
  return boost;
}